

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZAutoPointer<TPZCompMesh> local_20;
  
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19b7cd8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19b7da0;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf8 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xfc = 1;
  local_20 = (TPZAutoPointer<TPZCompMesh>)cmesh->fRef;
  LOCK();
  ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__019b6178,&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19b77b8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19b76d8;
  TPZStructMatrixTBBFlow<double>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<double> *)
             &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
              super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019b61a0);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19b75c8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19b7408;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x19b74d0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  _vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  fStore = (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  fNAlloc = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  ._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  .fStore = (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  .fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  .fNAlloc = 0;
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19b60f0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19b5f30;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x19b5ff8;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}